

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O0

void __thiscall OpenDataServerCommand::doCommand(OpenDataServerCommand *this)

{
  unsigned_long uVar1;
  reference pvVar2;
  DataReaderServer *this_00;
  double dVar3;
  pthread_t local_140;
  pthread_t tId;
  DataReaderServer *temp;
  Params *params;
  int local_ec;
  undefined1 local_e8 [4];
  int perSec;
  undefined1 local_d0 [8];
  string perSecStr;
  int local_78 [2];
  int port;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined1 local_50 [40];
  ExpressionUtils expUtils;
  unsigned_long index;
  OpenDataServerCommand *this_local;
  
  uVar1 = DataCommands::getIndex(this->dataCommands);
  expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(uVar1 + 1);
  ExpressionUtils::ExpressionUtils((ExpressionUtils *)(local_50 + 0x20));
  DataCommands::getSeparated_abi_cxx11_(&local_68,this->dataCommands);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&local_68,
                (size_type)
                expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)local_50,(string *)pvVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((long)expUtils.deathMap.
                       super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 1);
  DataVars::getSymbolTable_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)((long)&perSecStr.
                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                        .
                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                        ._M_storage._M_storage + 0x10),this->dataVars);
  dVar3 = ExpressionUtils::calculateInfixStr
                    ((ExpressionUtils *)(local_50 + 0x20),(string *)local_50,
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)((long)&perSecStr.
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                                .
                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                                ._M_storage._M_storage + 0x10));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)((long)&perSecStr.
                              super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                              .
                              super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                              ._M_storage._M_storage + 0x10));
  local_78[0] = (int)dVar3;
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_e8,this->dataCommands);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_e8,
                (size_type)
                expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)local_d0,(string *)pvVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e8);
  expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)((long)expUtils.deathMap.
                       super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 1);
  DataVars::getSymbolTable_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)&params,this->dataVars);
  dVar3 = ExpressionUtils::calculateInfixStr
                    ((ExpressionUtils *)(local_50 + 0x20),(string *)local_d0,
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *)&params);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    *)&params);
  local_ec = (int)dVar3;
  temp = (DataReaderServer *)operator_new(8);
  temp->port = 0;
  temp->perSec = 0;
  std::vector<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>::
  push_back(&this->deathMap2,(value_type *)&temp);
  this_00 = (DataReaderServer *)operator_new(0x40);
  DataReaderServer::DataReaderServer
            (this_00,local_78,&local_ec,this->dataBinds,this->dataVars,&this->mutex);
  *(DataReaderServer **)temp = this_00;
  tId = (pthread_t)this_00;
  std::vector<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>::push_back
            (&this->deathMap1,(value_type *)&tId);
  pthread_create(&local_140,(pthread_attr_t *)0x0,openServer_thread_callback,temp);
  DataCommands::setIndex
            (this->dataCommands,
             (unsigned_long)
             expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)local_50);
  ExpressionUtils::~ExpressionUtils((ExpressionUtils *)(local_50 + 0x20));
  return;
}

Assistant:

void OpenDataServerCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;

    ExpressionUtils expUtils;

    // get the port from the vector in dataCommands
    string portStr = this->dataCommands->getSeparated().at(index);
    // skip the port
    index++;
    int port = static_cast<int>(expUtils.calculateInfixStr(portStr, this->dataVars->getSymbolTable()));

    // get the perSec from the vector in dataCommands
    string perSecStr = this->dataCommands->getSeparated().at(index);
    // skip the perSec
    index++;
    int perSec = static_cast<int>(expUtils.calculateInfixStr(perSecStr, this->dataVars->getSymbolTable()));

    // create a struct of the thread params
    struct Params *params;
    params = new Params();
    this->deathMap2.push_back(params);

    DataReaderServer* temp;
    temp = new DataReaderServer(port, perSec, this->dataBinds, this->dataVars, this->mutex);
    // put values into the params
    params->dataReaderServer = temp;
    this->deathMap1.push_back(temp);

    pthread_t tId;
    // Launch a thread
    pthread_create(&tId, nullptr, openServer_thread_callback, params);

    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}